

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-list.c
# Opt level: O0

wchar_t monster_list_standard_compare(void *a,void *b)

{
  long lVar1;
  long lVar2;
  monster_race *br;
  monster_race *ar;
  void *b_local;
  void *a_local;
  
  lVar1 = *a;
  lVar2 = *b;
  if ((lVar1 == 0) || (lVar2 == 0)) {
    a_local._4_4_ = L'\x01';
  }
  else if (*(int *)(lVar2 + 0x80) < *(int *)(lVar1 + 0x80)) {
    a_local._4_4_ = L'\xffffffff';
  }
  else if (*(int *)(lVar1 + 0x80) < *(int *)(lVar2 + 0x80)) {
    a_local._4_4_ = L'\x01';
  }
  else {
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

int monster_list_standard_compare(const void *a, const void *b)
{
	const struct monster_race *ar = ((monster_list_entry_t *)a)->race;
	const struct monster_race *br = ((monster_list_entry_t *)b)->race;

	/* If this happens, something might be wrong in the collect function. */
	if (ar == NULL || br == NULL)
		return 1;

	/* Check depth first.*/
	if (ar->level > br->level)
		return -1;

	if (ar->level < br->level)
		return 1;

	return 0;
}